

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O2

void __thiscall
duckdb::ReservoirQuantileState<long>::FillReservoir
          (ReservoirQuantileState<long> *this,idx_t sample_size,long element)

{
  ulong uVar1;
  long local_8;
  
  uVar1 = this->pos;
  local_8 = element;
  if (uVar1 < sample_size) {
    this->pos = uVar1 + 1;
    this->v[uVar1] = element;
    duckdb::BaseReservoirSampling::InitializeReservoirWeights((ulong)this->r_samp,this->pos);
    return;
  }
  if (*(long *)(this->r_samp + 0x30) == *(long *)(this->r_samp + 0x48)) {
    ReplaceElement(this,&local_8);
  }
  return;
}

Assistant:

void FillReservoir(idx_t sample_size, T element) {
		if (pos < sample_size) {
			v[pos++] = element;
			r_samp->InitializeReservoirWeights(pos, len);
		} else {
			D_ASSERT(r_samp->next_index_to_sample >= r_samp->num_entries_to_skip_b4_next_sample);
			if (r_samp->next_index_to_sample == r_samp->num_entries_to_skip_b4_next_sample) {
				ReplaceElement(element);
			}
		}
	}